

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator1D_imexmri.c
# Opt level: O2

int LaplaceMatrix(sunrealtype c,SUNMatrix Jac,UserData udata)

{
  double dVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  dVar1 = udata->dx;
  lVar5 = udata->N + -1;
  lVar7 = 0x40;
  for (lVar6 = 1; lVar6 < lVar5; lVar6 = lVar6 + 1) {
    lVar2 = *(long *)((long)Jac->content + 0x28);
    lVar3 = *(long *)((long)Jac->content + 0x40);
    lVar4 = *(long *)(lVar3 + -0x40 + lVar7);
    *(double *)(lVar4 + 0x18 + lVar2 * 8) =
         (udata->du / dVar1) / dVar1 + *(double *)(lVar4 + 0x18 + lVar2 * 8);
    lVar4 = *(long *)(lVar3 + -0x38 + lVar7);
    *(double *)(lVar4 + 0x18 + lVar2 * 8) =
         (udata->dv / dVar1) / dVar1 + *(double *)(lVar4 + 0x18 + lVar2 * 8);
    lVar4 = *(long *)(lVar3 + -0x30 + lVar7);
    *(double *)(lVar4 + 0x18 + lVar2 * 8) =
         (udata->dw / dVar1) / dVar1 + *(double *)(lVar4 + 0x18 + lVar2 * 8);
    lVar4 = *(long *)(lVar3 + -0x28 + lVar7);
    *(double *)(lVar4 + lVar2 * 8) =
         *(double *)(lVar4 + lVar2 * 8) - ((udata->du + udata->du) / dVar1) / dVar1;
    lVar4 = *(long *)(lVar3 + -0x20 + lVar7);
    *(double *)(lVar4 + lVar2 * 8) =
         *(double *)(lVar4 + lVar2 * 8) - ((udata->dv + udata->dv) / dVar1) / dVar1;
    lVar4 = *(long *)(lVar3 + -0x18 + lVar7);
    *(double *)(lVar4 + lVar2 * 8) =
         *(double *)(lVar4 + lVar2 * 8) - ((udata->dw + udata->dw) / dVar1) / dVar1;
    lVar4 = *(long *)(lVar3 + -0x10 + lVar7);
    *(double *)(lVar4 + -0x18 + lVar2 * 8) =
         (udata->du / dVar1) / dVar1 + *(double *)(lVar4 + -0x18 + lVar2 * 8);
    lVar4 = *(long *)(lVar3 + -8 + lVar7);
    *(double *)(lVar4 + -0x18 + lVar2 * 8) =
         (udata->dv / dVar1) / dVar1 + *(double *)(lVar4 + -0x18 + lVar2 * 8);
    *(double *)(*(long *)(lVar3 + lVar7) + -0x18 + lVar2 * 8) =
         (udata->dw / dVar1) / dVar1 + *(double *)(*(long *)(lVar3 + lVar7) + -0x18 + lVar2 * 8);
    lVar7 = lVar7 + 0x18;
  }
  return (int)lVar5;
}

Assistant:

static int LaplaceMatrix(sunrealtype c, SUNMatrix Jac, UserData udata)
{
  sunindextype N = udata->N; /* set shortcuts */
  sunrealtype dx = udata->dx;
  sunindextype i;

  /* iterate over intervals, filling in Jacobian of (L*y) using SM_ELEMENT_B
     macro (see sunmatrix_band.h) */
  for (i = 1; i < N - 1; i++)
  {
    SM_ELEMENT_B(Jac, IDX(i, 0), IDX(i - 1, 0)) += c * udata->du / dx / dx;
    SM_ELEMENT_B(Jac, IDX(i, 1), IDX(i - 1, 1)) += c * udata->dv / dx / dx;
    SM_ELEMENT_B(Jac, IDX(i, 2), IDX(i - 1, 2)) += c * udata->dw / dx / dx;
    SM_ELEMENT_B(Jac, IDX(i, 0), IDX(i, 0)) += -c * SUN_RCONST(2.0) *
                                               udata->du / dx / dx;
    SM_ELEMENT_B(Jac, IDX(i, 1), IDX(i, 1)) += -c * SUN_RCONST(2.0) *
                                               udata->dv / dx / dx;
    SM_ELEMENT_B(Jac, IDX(i, 2), IDX(i, 2)) += -c * SUN_RCONST(2.0) *
                                               udata->dw / dx / dx;
    SM_ELEMENT_B(Jac, IDX(i, 0), IDX(i + 1, 0)) += c * udata->du / dx / dx;
    SM_ELEMENT_B(Jac, IDX(i, 1), IDX(i + 1, 1)) += c * udata->dv / dx / dx;
    SM_ELEMENT_B(Jac, IDX(i, 2), IDX(i + 1, 2)) += c * udata->dw / dx / dx;
  }

  /* Return with success */
  return 0;
}